

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O3

int ComparePixelsLossy(uint32_t *src,int src_step,uint32_t *dst,int dst_step,int length,
                      int max_allowed_diff)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if (length < 1) {
    return 1;
  }
  uVar3 = max_allowed_diff * 0xff;
  uVar5 = length + 1;
  while( true ) {
    uVar1 = *src;
    uVar2 = *dst;
    uVar4 = uVar1 >> 0x18;
    if (uVar4 != uVar2 >> 0x18) {
      return 0;
    }
    iVar7 = (uVar1 >> 0x10 & 0xff) - (uVar2 >> 0x10 & 0xff);
    iVar6 = -iVar7;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    if ((int)uVar3 < (int)(iVar6 * uVar4)) {
      return 0;
    }
    iVar7 = (uVar1 >> 8 & 0xff) - (uVar2 >> 8 & 0xff);
    iVar6 = -iVar7;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    if (uVar3 < iVar6 * uVar4) {
      return 0;
    }
    iVar7 = (uVar1 & 0xff) - (uVar2 & 0xff);
    iVar6 = -iVar7;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    if (uVar3 < iVar6 * uVar4) break;
    uVar5 = uVar5 - 1;
    src = src + src_step;
    dst = dst + dst_step;
    if (uVar5 < 2) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static WEBP_INLINE int ComparePixelsLossy(const uint32_t* src, int src_step,
                                          const uint32_t* dst, int dst_step,
                                          int length, int max_allowed_diff) {
  assert(length > 0);
  while (length-- > 0) {
    if (!PixelsAreSimilar(*src, *dst, max_allowed_diff)) {
      return 0;
    }
    src += src_step;
    dst += dst_step;
  }
  return 1;
}